

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DDLNode.cpp
# Opt level: O2

void __thiscall ODDLParser::DDLNode::attachParent(DDLNode *this,DDLNode *parent)

{
  DDLNode *local_8;
  
  if ((this->m_parent != parent) && (this->m_parent = parent, parent != (DDLNode *)0x0)) {
    local_8 = this;
    std::vector<ODDLParser::DDLNode*,std::allocator<ODDLParser::DDLNode*>>::
    emplace_back<ODDLParser::DDLNode*>
              ((vector<ODDLParser::DDLNode*,std::allocator<ODDLParser::DDLNode*>> *)
               &parent->m_children,&local_8);
  }
  return;
}

Assistant:

void DDLNode::attachParent( DDLNode *parent ) {
    if( m_parent == parent ) {
        return;
    }

    m_parent = parent;
    if( ddl_nullptr != m_parent ) {
        m_parent->m_children.push_back( this );
    }
}